

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTable * __thiscall ImPool<ImGuiTable>::TryGetMapData(ImPool<ImGuiTable> *this,ImPoolIdx n)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  char *__function;
  
  if ((n < 0) || ((this->Map).Data.Size <= n)) {
    __function = 
    "T &ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](int) [T = ImGuiStorage::ImGuiStoragePair]"
    ;
LAB_0017c2c5:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                  ,0x74f,__function);
  }
  uVar1 = (this->Map).Data.Data[(uint)n].field_1.val_i;
  if ((ulong)uVar1 == 0xffffffff) {
    pIVar2 = (ImGuiTable *)0x0;
  }
  else {
    if (((int)uVar1 < 0) || ((this->Buf).Size <= (int)uVar1)) {
      __function = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
      goto LAB_0017c2c5;
    }
    pIVar2 = (this->Buf).Data + uVar1;
  }
  return pIVar2;
}

Assistant:

T*          TryGetMapData(ImPoolIdx n)          { int idx = Map.Data[n].val_i; if (idx == -1) return NULL; return GetByIndex(idx); }